

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ClassesCollectOneClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Vec_Ptr_t *vRoots)

{
  long lVar1;
  
  vRoots->nSize = 0;
  for (lVar1 = 0; lVar1 < p->pClassSizes[pRepr->Id]; lVar1 = lVar1 + 1) {
    if (p->pId2Class[pRepr->Id][lVar1] != (Aig_Obj_t *)0x0) {
      Vec_PtrPush(vRoots,p->pId2Class[pRepr->Id][lVar1]);
    }
  }
  if (1 < vRoots->nSize) {
    return;
  }
  __assert_fail("Vec_PtrSize(vRoots) > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                ,0x214,"void Dch_ClassesCollectOneClass(Dch_Cla_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dch_ClassesCollectOneClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Vec_Ptr_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vRoots );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Vec_PtrPush( vRoots, pObj );
    assert( Vec_PtrSize(vRoots) > 1 ); 
}